

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O0

Function * __thiscall
TCV::getRightFunction
          (TCV *this,vector<Function_*,_std::allocator<Function_*>_> *__functions,ASTNode *_node)

{
  bool bVar1;
  ASTNode *_node_00;
  reference ppFVar2;
  vector<Variable_*,_std::allocator<Variable_*>_> *pvVar3;
  size_type sVar4;
  size_type sVar5;
  ulong uVar6;
  const_reference ppVVar7;
  string *psVar8;
  reference rhs;
  undefined1 local_98 [8];
  string fType;
  int local_70;
  int i;
  int matchedParams;
  Function **_function;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Function_*,_std::allocator<Function_*>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  callParams;
  ASTNode *_node_local;
  vector<Function_*,_std::allocator<Function_*>_> *__functions_local;
  TCV *this_local;
  
  callParams.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)_node;
  _node_00 = AST::ASTNode::getChild(_node,1);
  getParamsType_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1,this,_node_00);
  __end1 = std::vector<Function_*,_std::allocator<Function_*>_>::begin(__functions);
  _function = (Function **)std::vector<Function_*,_std::allocator<Function_*>_>::end(__functions);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Function_*const_*,_std::vector<Function_*,_std::allocator<Function_*>_>_>
                                *)&_function);
    if (!bVar1) {
      this_local = (TCV *)0x0;
LAB_00168045:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1);
      return (Function *)this_local;
    }
    ppFVar2 = __gnu_cxx::
              __normal_iterator<Function_*const_*,_std::vector<Function_*,_std::allocator<Function_*>_>_>
              ::operator*(&__end1);
    pvVar3 = Function::getParams(*ppFVar2);
    sVar4 = std::vector<Variable_*,_std::allocator<Variable_*>_>::size(pvVar3);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
    if (sVar4 == sVar5) {
      local_70 = 0;
      fType.field_2._12_4_ = 0;
      while( true ) {
        uVar6 = (ulong)(int)fType.field_2._12_4_;
        pvVar3 = Function::getParams(*ppFVar2);
        sVar4 = std::vector<Variable_*,_std::allocator<Variable_*>_>::size(pvVar3);
        if (sVar4 <= uVar6) break;
        pvVar3 = Function::getParams(*ppFVar2);
        ppVVar7 = std::vector<Variable_*,_std::allocator<Variable_*>_>::at
                            (pvVar3,(long)(int)fType.field_2._12_4_);
        psVar8 = Variable::getType_abi_cxx11_(*ppVVar7);
        std::__cxx11::string::string((string *)local_98,(string *)psVar8);
        rhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1,(long)(int)fType.field_2._12_4_);
        bVar1 = isMatchType((string *)local_98,rhs);
        if (bVar1) {
          local_70 = local_70 + 1;
        }
        std::__cxx11::string::~string((string *)local_98);
        if (!bVar1) break;
        fType.field_2._12_4_ = fType.field_2._12_4_ + 1;
      }
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1);
      if ((long)local_70 == sVar4) {
        this_local = (TCV *)*ppFVar2;
        goto LAB_00168045;
      }
    }
    __gnu_cxx::
    __normal_iterator<Function_*const_*,_std::vector<Function_*,_std::allocator<Function_*>_>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

Function *TCV::getRightFunction(const std::vector<Function *> &__functions, AST::ASTNode *_node) {
    auto callParams = getParamsType(_node->getChild(1));
    for (const auto &_function : __functions) {
        if (_function->getParams().size() != callParams.size()) continue;
        int matchedParams = 0;
        for (int i = 0; i < _function->getParams().size(); i++) {
            auto fType = _function->getParams().at(i)->getType();
            if (!isMatchType(fType, callParams.at(i))) break;
            else matchedParams++;
        }
        if (matchedParams == callParams.size()) return _function;
    }
    return nullptr;
}